

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostei_deriv1_generator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_color _Var6;
  ostream *poVar7;
  _Rb_tree_color *p_Var8;
  mapped_type *pmVar9;
  runtime_error *prVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  initializer_list<std::pair<const_Option,_int>_> __l;
  OSTEIDeriv1_Writer ostei_deriv1_writer;
  string hpath;
  string fpath;
  QuartetSet topquartets;
  size_t iarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otheropt;
  OptionMap options;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> needed_am;
  OSTEI_VRR_Writer vrr_writer;
  OSTEI_HRR_Writer hrr_writer;
  OSTEI_GeneratorInfo info;
  Makowski_HRR hrralgo;
  Makowski_VRR vrralgo;
  ofstream of;
  ofstream ofh;
  undefined8 local_d78;
  _Rb_tree_node_base _Stack_d70;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined1 auStack_d40 [8];
  undefined1 local_d38 [16];
  _Alloc_hider local_d28;
  OSTEI_GeneratorInfo *local_d20;
  char local_d18 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  undefined1 local_cc8 [16];
  _Alloc_hider local_cb8;
  _Base_ptr local_cb0;
  char local_ca8;
  undefined7 uStack_ca7;
  undefined8 uStack_ca0;
  char *local_c90;
  _Base_ptr local_c88;
  char local_c80;
  undefined7 uStack_c7f;
  undefined8 uStack_c78;
  size_t local_c70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c68;
  _Base_ptr local_c50;
  _Base_ptr local_c48;
  undefined1 local_c40 [28];
  int iStack_c24;
  _Rb_tree_color _Stack_c20;
  int iStack_c1c;
  char *local_c18 [2];
  char local_c08 [16];
  _Rb_tree<Option,_std::pair<const_Option,_int>,_std::_Select1st<std::pair<const_Option,_int>_>,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
  local_bf8;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_bc8;
  undefined1 local_b98 [16];
  _Alloc_hider local_b88;
  char local_b78 [24];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_b60;
  OSTEI_VRR_Writer local_b30;
  OSTEI_HRR_Writer local_b10;
  OSTEI_GeneratorInfo local_af0;
  OSTEI_HRR_Algorithm_Base local_9c8;
  OSTEI_VRR_Algorithm_Base local_6d0;
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  local_ce8._M_string_length = 0;
  local_ce8.field_2._M_local_buf[0] = '\0';
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  local_d08._M_string_length = 0;
  local_d08.field_2._M_local_buf[0] = '\0';
  local_c50 = (_Base_ptr)local_c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"");
  _Stack_d70._M_parent = (_Base_ptr)&_Stack_d70._M_right;
  local_d78 = (_func_int **)0x0;
  _Stack_d70._M_color = _S_red;
  _Stack_d70._4_4_ = 0;
  if (local_c50 == (_Base_ptr)local_c40) {
    uStack_d50 = local_c40._8_8_;
  }
  else {
    _Stack_d70._M_parent = local_c50;
  }
  _Stack_d70._M_left = local_c48;
  local_c48 = (_Base_ptr)0x0;
  local_c40[0] = 0;
  local_9c8.info_.super_GeneratorInfoBase.finalam_.qam._M_elems[0] = 2;
  local_9c8.info_.super_GeneratorInfoBase.finalam_.qam._M_elems[1] = 0;
  local_9c8.info_.super_GeneratorInfoBase.finalam_.qam._M_elems[2] = 3;
  local_9c8.info_.super_GeneratorInfoBase.finalam_.qam._M_elems[3] = 0;
  local_9c8._vptr_OSTEI_HRR_Algorithm_Base = (_func_int **)0x0;
  local_9c8.info_.super_GeneratorInfoBase._vptr_GeneratorInfoBase = (_func_int **)0x1;
  local_9c8.info_.super_GeneratorInfoBase.finalam_.tag._M_dataplus._M_p = (pointer)0x4;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_9c8;
  local_c50 = (_Base_ptr)local_c40;
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::map
            ((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_> *)
             &local_bf8,__l,(less<Option> *)&local_6d0,(allocator_type *)&local_430);
  ParseCommonOptions_abi_cxx11_(&local_c68,(OptionMap *)&local_bf8,argc,argv);
  local_c70 = 0;
  bVar4 = false;
  local_d48 = (_func_int **)((ulong)local_d48._4_4_ << 0x20);
  while (local_c70 <
         (ulong)((long)local_c68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    GetNextArg((string *)&local_9c8,&local_c70,&local_c68);
    iVar5 = std::__cxx11::string::compare((char *)&local_9c8);
    if (iVar5 == 0) {
      GetNextArg((string *)&local_6d0,&local_c70,&local_c68);
      this = &local_ce8;
LAB_001066f7:
      std::__cxx11::string::operator=((string *)this,(string *)&local_6d0);
      if ((QAM *)local_6d0._vptr_OSTEI_VRR_Algorithm_Base !=
          &local_6d0.info_.super_GeneratorInfoBase.finalam_) {
        operator_delete(local_6d0._vptr_OSTEI_VRR_Algorithm_Base);
      }
      bVar1 = true;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_9c8);
      if (iVar5 == 0) {
        GetNextArg((string *)&local_6d0,&local_c70,&local_c68);
        this = &local_d08;
        goto LAB_001066f7;
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_9c8);
      if (iVar5 == 0) {
        iVar5 = GetIArg(&local_c70,&local_c68);
        local_d78 = (_func_int **)CONCAT44(local_d78._4_4_,iVar5);
        iVar5 = GetIArg(&local_c70,&local_c68);
        local_d78 = (_func_int **)CONCAT44(iVar5,(_Rb_tree_color)local_d78);
        _Var6 = GetIArg(&local_c70,&local_c68);
        _Stack_d70._M_color = _Var6;
        iVar5 = GetIArg(&local_c70,&local_c68);
        _Stack_d70._4_4_ = iVar5;
        bVar1 = true;
        bVar4 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--------------------------------\n",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unknown argument: ",0x12);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_9c8._vptr_OSTEI_HRR_Algorithm_Base,
                            (long)local_9c8.info_.super_GeneratorInfoBase._vptr_GeneratorInfoBase);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"--------------------------------\n",0x21);
        local_d48 = (_func_int **)CONCAT44(local_d48._4_4_,1);
        bVar1 = false;
      }
    }
    if ((QAM *)local_9c8._vptr_OSTEI_HRR_Algorithm_Base !=
        &local_9c8.info_.super_GeneratorInfoBase.finalam_) {
      operator_delete(local_9c8._vptr_OSTEI_HRR_Algorithm_Base);
    }
    if (!bVar1) goto LAB_00106ecf;
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_ce8);
  if (iVar5 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar12 = 0x25;
    pcVar14 = "output source file path (-o) required";
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_d08);
    if (iVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      lVar12 = 0x26;
      pcVar14 = "output header file path (-oh) required";
    }
    else {
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Generating source file ",0x17);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_ce8._M_dataplus._M_p,
                            local_ce8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Appending to header file ",0x19);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_d08._M_dataplus._M_p,
                            local_d08._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::ofstream::ofstream(&local_430,(string *)&local_ce8,_S_out);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                    ((string *)&local_9c8,(char (*) [19])"Cannot open file: ",&local_ce8,
                     (char (*) [2])0x14c86b);
          std::runtime_error::runtime_error(prVar10,(string *)&local_9c8);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::ofstream::ofstream(&local_230,(string *)&local_d08,_S_app);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                    ((string *)&local_9c8,(char (*) [19])"Cannot open file: ",&local_d08,
                     (char (*) [2])0x14c86b);
          std::runtime_error::runtime_error(prVar10,(string *)&local_9c8);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_b98._0_4_ = (_Rb_tree_color)local_d78;
        local_b98._4_4_ = local_d78._4_4_;
        local_b98._8_4_ = _Stack_d70._M_color;
        local_b98._12_4_ = _Stack_d70._4_4_;
        local_b88._M_p = local_b78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b88,_Stack_d70._M_parent,
                   (undefined1 *)
                   ((long)&(_Stack_d70._M_left)->_M_color + (long)&(_Stack_d70._M_parent)->_M_color)
                  );
        GeneratorInfoBase::GeneratorInfoBase
                  (&local_af0.super_GeneratorInfoBase,(QAM *)local_b98,1,(OptionMap *)&local_bf8);
        local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header;
        local_af0.super_GeneratorInfoBase._vptr_GeneratorInfoBase =
             (_func_int **)&PTR__OSTEI_GeneratorInfo_0015cb28;
        local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header;
        local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header;
        local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_af0.bcontq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_af0.primq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_af0.contq_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (local_b88._M_p != local_b78) {
          operator_delete(local_b88._M_p);
        }
        OSTEI_HRR_Algorithm_Base::OSTEI_HRR_Algorithm_Base(&local_9c8,&local_af0);
        local_9c8._vptr_OSTEI_HRR_Algorithm_Base =
             (_func_int **)&PTR__OSTEI_HRR_Algorithm_Base_0015cb90;
        OSTEI_VRR_Algorithm_Base::OSTEI_VRR_Algorithm_Base(&local_6d0,&local_af0);
        local_6d0._vptr_OSTEI_VRR_Algorithm_Base =
             (_func_int **)&PTR__OSTEI_VRR_Algorithm_Base_0015cbe0;
        local_bc8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_bc8._M_impl.super__Rb_tree_header._M_header;
        local_bc8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_bc8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_bc8._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var8 = (_Rb_tree_color *)&local_d78;
        lVar12 = 4;
        do {
          if ((int)*p_Var8 < *(int *)((long)&local_d78 + lVar12)) {
            p_Var8 = (_Rb_tree_color *)((long)&local_d78 + lVar12);
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x10);
        _Var6 = *p_Var8;
        uVar11 = 0;
        if ((_Rb_tree_color)local_d78 != _Var6) {
          uVar11 = 1;
          if (local_d78._4_4_ != _Var6) {
            uVar11 = _Stack_d70._M_color == _Var6 ^ 3;
          }
        }
        uVar13 = 0;
        local_bc8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_bc8._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (uVar11 * 4 != uVar13) {
            local_d48 = local_d78;
            auStack_d40 = (undefined1  [8])_Stack_d70._0_8_;
            std::__cxx11::string::string
                      ((string *)&local_c90,
                       (char *)((long)&DAT_0013f17c + (long)*(int *)((long)&DAT_0013f17c + uVar13)),
                       (allocator *)local_d38);
            local_cc8._0_8_ = local_d48;
            local_cc8._8_8_ = auStack_d40;
            if (local_c90 == &local_c80) {
              uStack_ca0 = uStack_c78;
              local_cb8._M_p = &local_ca8;
            }
            else {
              local_cb8._M_p = local_c90;
            }
            uStack_ca7 = uStack_c7f;
            local_ca8 = local_c80;
            local_cb0 = local_c88;
            local_c88 = (_Base_ptr)0x0;
            local_c80 = '\0';
            local_d38._0_8_ = local_d78;
            local_d38._8_4_ = _Stack_d70._M_color;
            local_d38._12_4_ = _Stack_d70._4_4_;
            local_d28._M_p = local_d18;
            local_c90 = &local_c80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d28,_Stack_d70._M_parent,
                       (undefined1 *)
                       ((long)&(_Stack_d70._M_left)->_M_color +
                       (long)&(_Stack_d70._M_parent)->_M_color));
            *(int *)(local_cc8 + uVar13) = *(int *)(local_cc8 + uVar13) + 1;
            *(int *)(local_d38 + uVar13) = *(int *)(local_d38 + uVar13) + -1;
            std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
            _M_insert_unique<QAM_const&>
                      ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *)
                       &local_bc8,(QAM *)local_cc8);
            local_c40._24_4_ = local_d38._0_4_;
            iStack_c24 = local_d38._4_4_;
            _Stack_c20 = local_d38._8_4_;
            iStack_c1c = local_d38._12_4_;
            local_c18[0] = local_c08;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c18,local_d28._M_p,
                       local_d28._M_p + (long)&local_d20->super_GeneratorInfoBase);
            bVar4 = ValidQAM((QAM *)(local_c40 + 0x18));
            if (local_c18[0] != local_c08) {
              operator_delete(local_c18[0]);
            }
            if (bVar4) {
              std::_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>>::
              _M_insert_unique<QAM_const&>
                        ((_Rb_tree<QAM,QAM,std::_Identity<QAM>,std::less<QAM>,std::allocator<QAM>> *
                         )&local_bc8,(QAM *)local_d38);
            }
            if (local_d28._M_p != local_d18) {
              operator_delete(local_d28._M_p);
            }
            if (local_cb8._M_p != &local_ca8) {
              operator_delete(local_cb8._M_p);
            }
          }
          uVar13 = uVar13 + 4;
        } while (uVar13 != 0x10);
        local_af0.deriv1_missing_center_ = uVar11;
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
                  (&local_b60,&local_bc8);
        OSTEI_HRR_Algorithm_Base::Create
                  (&local_9c8,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_b60);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_b60);
        local_cc8._0_4_ = 2;
        pmVar9 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)&local_bf8,(key_type *)local_cc8);
        iVar5 = *pmVar9;
        local_d38._0_4_ = GeneralHRR;
        pmVar9 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)&local_bf8,(key_type *)local_d38);
        OSTEI_HRR_Writer::OSTEI_HRR_Writer(&local_b10,&local_9c8,&local_af0,iVar5,*pmVar9);
        OSTEI_HRR_Algorithm_Base::TopQuartets((QuartetSet *)local_cc8,&local_9c8);
        OSTEI_VRR_Algorithm_Base::Create(&local_6d0,(QuartetSet *)local_cc8);
        local_d38._0_8_ = (ulong)(uint)local_d38._4_4_ << 0x20;
        pmVar9 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)&local_bf8,(key_type *)local_d38);
        iVar5 = *pmVar9;
        local_c40._20_4_ = 1;
        pmVar9 = std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)&local_bf8,(key_type *)(local_c40 + 0x14));
        OSTEI_VRR_Writer::OSTEI_VRR_Writer(&local_b30,&local_6d0,&local_af0,iVar5,*pmVar9);
        OSTEI_Writer_Base::OSTEI_Writer_Base
                  ((OSTEI_Writer_Base *)local_d38,(ostream *)&local_430,(ostream *)&local_230,
                   &local_af0,&local_b30,&local_b10);
        local_d38._0_8_ = &PTR_WriteFile_0015cd58;
        OSTEIDeriv1_Writer::WriteFile((OSTEIDeriv1_Writer *)local_d38);
        std::
        _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
        ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                     *)local_cc8);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_bc8);
        OSTEI_VRR_Algorithm_Base::~OSTEI_VRR_Algorithm_Base(&local_6d0);
        OSTEI_HRR_Algorithm_Base::~OSTEI_HRR_Algorithm_Base(&local_9c8);
        local_af0.super_GeneratorInfoBase._vptr_GeneratorInfoBase =
             (_func_int **)&PTR__OSTEI_GeneratorInfo_0015cb28;
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_af0.contq_._M_t);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_af0.primq_._M_t);
        std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::
        ~_Rb_tree(&local_af0.bcontq_._M_t);
        GeneratorInfoBase::~GeneratorInfoBase(&local_af0.super_GeneratorInfoBase);
        uVar2 = __filebuf;
        lVar12 = _VTT;
        local_230 = _VTT;
        *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(aiStack_138);
        local_430 = lVar12;
        *(undefined8 *)(local_428 + *(long *)(lVar12 + -0x18) + -8) = uVar2;
        std::filebuf::~filebuf(local_428);
        std::ios_base::~ios_base(aiStack_338);
        local_d48 = (_func_int **)((ulong)local_d48 & 0xffffffff00000000);
LAB_00106ecf:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c68);
        std::
        _Rb_tree<Option,_std::pair<const_Option,_int>,_std::_Select1st<std::pair<const_Option,_int>_>,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
        ::~_Rb_tree(&local_bf8);
        if (_Stack_d70._M_parent != (_Base_ptr)&_Stack_d70._M_right) {
          operator_delete(_Stack_d70._M_parent);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
          operator_delete(local_d08._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
          operator_delete(local_ce8._M_dataplus._M_p);
        }
        return (int)local_d48;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      lVar12 = 0x18;
      pcVar14 = "AM quartet (-q) required";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar12);
  local_d48 = (_func_int **)CONCAT44(local_d48._4_4_,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
  goto LAB_00106ecf;
}

Assistant:

int main(int argc, char ** argv)
{
    try {


    // other stuff
    std::string fpath;
    std::string hpath;
    QAM finalam{0,0,0,0};

    bool finalamset = false;

    // parse command line
    OptionMap options = DefaultOptions();
    std::vector<std::string> otheropt = ParseCommonOptions(options, argc, argv);

    // parse specific options
    size_t iarg = 0;
    while(iarg < otheropt.size())
    {
        std::string argstr(GetNextArg(iarg, otheropt));
        if(argstr == "-o")
            fpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-oh")
            hpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-q")
        {
            finalam[0] = GetIArg(iarg, otheropt);   
            finalam[1] = GetIArg(iarg, otheropt);   
            finalam[2] = GetIArg(iarg, otheropt);   
            finalam[3] = GetIArg(iarg, otheropt);   
            finalamset = true;
        }
        else
        {
            std::cout << "\n\n";
            std::cout << "--------------------------------\n";
            std::cout << "Unknown argument: " << argstr << "\n";
            std::cout << "--------------------------------\n";
            return 1; 
        } 
    }


    // check for required options
    CMDLINE_ASSERT( fpath != "", "output source file path (-o) required" )
    CMDLINE_ASSERT( hpath != "", "output header file path (-oh) required" )
    CMDLINE_ASSERT( finalamset == true, "AM quartet (-q) required" )


    // open the output file
    // actually create
    std::cout << "Generating source file " << fpath << "\n";
    std::cout << "Appending to header file " << hpath << "\n";

    std::ofstream of(fpath);
    if(!of.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", fpath, "\n"));

    std::ofstream ofh(hpath, std::ofstream::app);
    if(!ofh.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", hpath, "\n"));
    

    // Information for this OSTEI
    OSTEI_GeneratorInfo info(finalam, 1, options);


    //////////////////////////////////////////////////////////////
    //! \todo Are there special permutations for derivatives?
    //////////////////////////////////////////////////////////////

    // algorithms used
    Makowski_HRR hrralgo(info);
    Makowski_VRR vrralgo(info);

    // Working backwards, I need:
    // 1.) HRR Steps
    //     We need the different increments, decrements for derivatives
    std::set<QAM> needed_am;

    // We only need to do three centers. The fourth is free
    // Find which one to skip
    int max = *(std::max_element(finalam.begin(), finalam.end()));
    
    int missing_center;
    if(finalam[0] == max)
        missing_center = 0;
    else if(finalam[1] == max)
        missing_center = 1;
    else if(finalam[2] == max)
        missing_center = 2;
    else
        missing_center = 3;
    
    const char * dir[4] = {"2a", "2b", "2c", "2d"};
    for(int i = 0; i < 4; i++)
    {
        if(i == missing_center)
            continue;

        QAM amtmp_p(finalam.qam, dir[i]);
        QAM amtmp_m(finalam);
        amtmp_p.qam[i]++;
        amtmp_m.qam[i]--;

        needed_am.insert(amtmp_p);
        if(ValidQAM(amtmp_m))
            needed_am.insert(amtmp_m);
    }

    info.SetDeriv1_MissingCenter(missing_center);

    hrralgo.Create(needed_am);
    OSTEI_HRR_Writer hrr_writer(hrralgo, info,
                                options[Option::ExternalHRR],
                                options[Option::GeneralHRR]);

    QuartetSet topquartets = hrralgo.TopQuartets();

    // 2.) VRR Steps
    vrralgo.Create(topquartets);
    OSTEI_VRR_Writer vrr_writer(vrralgo, info,
                                options[Option::ExternalVRR],
                                options[Option::GeneralVRR]);


    // Create the OSTEI_Writer and write the file
    OSTEIDeriv1_Writer ostei_deriv1_writer(of, ofh, info, vrr_writer, hrr_writer);
    ostei_deriv1_writer.WriteFile();



    }
    catch(std::exception & ex)
    {
        std::cout << "\n\n";
        std::cout << "Caught exception\n";
        std::cout << "What = " << ex.what() << "\n\n";
        return 1;
    }
    return 0;
}